

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O2

unique_ptr<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_> __thiscall
llvm::DWARFContext::create
          (DWARFContext *this,
          StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
          *Sections,uint8_t AddrSize,bool isLittleEndian)

{
  __uniq_ptr_data<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>,_true,_true>
  _Var1;
  DWARFSectionMap *this_00;
  uint uVar2;
  StringMapEntryBase **ppSVar3;
  StringMapEntryBase *pSVar4;
  bool bVar5;
  tuple<(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
  tVar6;
  StringSwitch<llvm::StringRef_*,_llvm::StringRef_*> *pSVar7;
  StringRef *pSVar8;
  DWARFSectionMap *pDVar9;
  DWARFContext *this_01;
  char *pcVar10;
  long lVar11;
  StringLiteral S;
  StringLiteral S_00;
  StringLiteral S_01;
  StringLiteral S_02;
  StringLiteral S_03;
  StringLiteral S_04;
  StringLiteral S_05;
  StringLiteral S_06;
  StringLiteral S_07;
  StringLiteral S_08;
  StringLiteral S_09;
  StringLiteral S_10;
  StringLiteral S_11;
  StringLiteral S_12;
  StringLiteral S_13;
  StringLiteral S_14;
  StringLiteral S_15;
  StringLiteral S_16;
  StringLiteral S_17;
  StringLiteral S_18;
  StringLiteral S_19;
  StringLiteral S_20;
  StringLiteral S_21;
  StringLiteral S_22;
  StringLiteral S_23;
  StringLiteral S_24;
  StringLiteral S_25;
  StringLiteral S_26;
  StringLiteral S_27;
  StringLiteral S_28;
  StringLiteral S_29;
  StringLiteral S_30;
  StringLiteral S_31;
  StringRef RHS;
  StringRef RHS_00;
  StringRef RHS_01;
  StringRef RHS_02;
  StringRef LHS;
  StringRef LHS_00;
  StringRef LHS_01;
  StringRef LHS_02;
  __uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
  local_70;
  __single_object DObj;
  pointer __p;
  StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_>
  local_38;
  const_iterator __begin2;
  
  tVar6.
  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
        )operator_new(0x5f8);
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl + 8)
       = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x10) = (StringMapEntryBase *)0x0;
  *(undefined ***)
   tVar6.
   super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
   .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl =
       &PTR__DWARFObjInMemory_00e22930;
  *(bool *)((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x18) = isLittleEndian;
  *(undefined1 *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x19) = 4;
  *(undefined4 *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x58) = 0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x60) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x20) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x28) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x30) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x38) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x40) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x48) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x68) = (StringMapEntryBase *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x58);
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x70) = (StringMapEntryBase *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x58);
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x78) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x80) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x88) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x90) = (StringMapEntryBase *)0x0;
  *(undefined4 *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0xa0) = 0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0xa8) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0xb0) = (StringMapEntryBase *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0xa0);
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0xb8) = (StringMapEntryBase *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0xa0);
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0xd0) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0xd8) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0xc0) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   200) = (StringMapEntryBase *)0x0;
  *(undefined4 *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0xe8) = 0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0xf0) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0xf8) = (StringMapEntryBase *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0xe8);
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x100) = (StringMapEntryBase *)
            ((long)tVar6.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                   _M_head_impl + 0xe8);
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x108) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x110) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x118) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x120) = (StringMapEntryBase *)0x0;
  *(undefined4 *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x130) = 0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x138) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x140) = (StringMapEntryBase *)
            ((long)tVar6.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                   _M_head_impl + 0x130);
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x148) = (StringMapEntryBase *)
            ((long)tVar6.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                   _M_head_impl + 0x130);
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x150) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x158) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x160) = (StringMapEntryBase *)0x0;
  *(StringMapEntryBase **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl +
   0x168) = (StringMapEntryBase *)0x0;
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x170));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x198));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x1c0));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x1e8));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x210));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x238));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x260));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x288));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x2b0));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x2d8));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x300));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x328));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x350));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x378));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x3a0));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x3c8));
  this_00 = (DWARFSectionMap *)
            ((long)tVar6.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                   _M_head_impl + 0x3f0);
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap(this_00);
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x418));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x440));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x468));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x490));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x4b8));
  anon_unknown.dwarf_2cf7d15::DWARFSectionMap::DWARFSectionMap
            ((DWARFSectionMap *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x4e0));
  memset((StringRef *)
         ((long)tVar6.
                super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                _M_head_impl + 0x508),0,0xa0);
  std::_Deque_base<llvm::SmallString<0U>,_std::allocator<llvm::SmallString<0U>_>_>::_Deque_base
            ((_Deque_base<llvm::SmallString<0U>,_std::allocator<llvm::SmallString<0U>_>_> *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                    _M_head_impl + 0x5a8));
  local_38.Ptr = (StringMapEntryBase **)
                 StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                 ::begin(Sections);
  uVar2 = (Sections->super_StringMapImpl).NumBuckets;
  ppSVar3 = (Sections->super_StringMapImpl).TheTable;
  do {
    if (local_38.Ptr == ppSVar3 + uVar2) {
      local_70._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
      .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl =
           (tuple<(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
            )(tuple<(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
              )tVar6.
               super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
               .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl
      ;
      this_01 = (DWARFContext *)operator_new(0x180);
      local_70._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
      .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl =
           (tuple<(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
            )(_Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
              )0x0;
      local_38.Ptr = (StringMapEntryBase **)
                     tVar6.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                     _M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&DObj,"",(allocator<char> *)((long)&__p + 7));
      DWARFContext(this_01,(unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                            *)&local_38,(string *)&DObj);
      (this->super_DIContext)._vptr_DIContext = (_func_int **)this_01;
      std::__cxx11::string::~string((string *)&DObj);
      if (local_38.Ptr != (StringMapEntryBase **)0x0) {
        (*(code *)(*local_38.Ptr)[1].StrLen)();
      }
      std::
      unique_ptr<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                     *)&local_70);
      return (__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>
              )(__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>
                )this;
    }
    pSVar4 = *local_38.Ptr;
    _Var1.
    super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
    ._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl =
         (__uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          )(pSVar4 + 2);
    S.super_StringRef.Length = 9;
    S.super_StringRef.Data = "debug_loc";
    DObj._M_t.
    super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
    ._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl =
         (__uniq_ptr_data<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>,_true,_true>
          )(__uniq_ptr_data<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>,_true,_true>
            )_Var1.
             super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
             .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl;
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x170));
    S_00.super_StringRef.Length = 0xe;
    S_00.super_StringRef.Data = "debug_loclists";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_00,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x198));
    S_01.super_StringRef.Length = 10;
    S_01.super_StringRef.Data = "debug_line";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_01,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x1c0));
    S_02.super_StringRef.Length = 0xb;
    S_02.super_StringRef.Data = "debug_frame";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_02,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x288));
    S_03.super_StringRef.Length = 8;
    S_03.super_StringRef.Data = "eh_frame";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_03,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x2b0));
    S_04.super_StringRef.Length = 0x11;
    S_04.super_StringRef.Data = "debug_str_offsets";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_04,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x238));
    S_05.super_StringRef.Length = 0xc;
    S_05.super_StringRef.Data = "debug_ranges";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_05,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x1e8));
    S_06.super_StringRef.Length = 0xe;
    S_06.super_StringRef.Data = "debug_rnglists";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_06,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x210));
    S_07.super_StringRef.Length = 0xd;
    S_07.super_StringRef.Data = "debug_loc.dwo";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_07,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x2d8));
    S_08.super_StringRef.Length = 0xe;
    S_08.super_StringRef.Data = "debug_line.dwo";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_08,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x260));
    S_09.super_StringRef.Length = 0xb;
    S_09.super_StringRef.Data = "debug_names";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_09,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x440));
    S_10.super_StringRef.Length = 0x12;
    S_10.super_StringRef.Data = "debug_rnglists.dwo";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_10,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x350));
    S_11.super_StringRef.Length = 0x15;
    S_11.super_StringRef.Data = "debug_str_offsets.dwo";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_11,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x300));
    S_12.super_StringRef.Length = 10;
    S_12.super_StringRef.Data = "debug_addr";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_12,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x378));
    S_13.super_StringRef.Length = 0xb;
    S_13.super_StringRef.Data = "apple_names";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_13,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x3a0));
    S_14.super_StringRef.Length = 0xe;
    S_14.super_StringRef.Data = "debug_pubnames";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_14,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x468));
    S_15.super_StringRef.Length = 0xe;
    S_15.super_StringRef.Data = "debug_pubtypes";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_15,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x490));
    S_16.super_StringRef.Length = 0x12;
    S_16.super_StringRef.Data = "debug_gnu_pubnames";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_16,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x4b8));
    S_17.super_StringRef.Length = 0x12;
    S_17.super_StringRef.Data = "debug_gnu_pubtypes";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_17,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x4e0));
    S_18.super_StringRef.Length = 0xb;
    S_18.super_StringRef.Data = "apple_types";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_18,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x3c8));
    S_19.super_StringRef.Length = 0x10;
    S_19.super_StringRef.Data = "apple_namespaces";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_19,this_00);
    S_20.super_StringRef.Length = 0xe;
    S_20.super_StringRef.Data = "apple_namespac";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_20,this_00);
    S_21.super_StringRef.Length = 10;
    S_21.super_StringRef.Data = "apple_objc";
    StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
    ::Case((StringSwitch<(anonymous_namespace)::DWARFSectionMap_*,_(anonymous_namespace)::DWARFSectionMap_*>
            *)&DObj,S_21,
           (DWARFSectionMap *)
           ((long)tVar6.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                  _M_head_impl + 0x418));
    S_22.super_StringRef.Length = 0xc;
    S_22.super_StringRef.Data = "debug_abbrev";
    DObj._M_t.
    super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
    ._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl =
         (__uniq_ptr_data<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>,_true,_true>
          )(__uniq_ptr_data<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>,_true,_true>
            )_Var1.
             super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
             .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl;
    pSVar7 = StringSwitch<llvm::StringRef_*,_llvm::StringRef_*>::Case
                       ((StringSwitch<llvm::StringRef_*,_llvm::StringRef_*> *)&DObj,S_22,
                        (StringRef *)
                        ((long)tVar6.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                               ._M_head_impl + 0x508));
    S_23.super_StringRef.Length = 0xd;
    S_23.super_StringRef.Data = "debug_aranges";
    pSVar7 = StringSwitch<llvm::StringRef_*,_llvm::StringRef_*>::Case
                       (pSVar7,S_23,
                        (StringRef *)
                        ((long)tVar6.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                               ._M_head_impl + 0x518));
    S_24.super_StringRef.Length = 9;
    S_24.super_StringRef.Data = "debug_str";
    pSVar7 = StringSwitch<llvm::StringRef_*,_llvm::StringRef_*>::Case
                       (pSVar7,S_24,
                        (StringRef *)
                        ((long)tVar6.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                               ._M_head_impl + 0x528));
    S_25.super_StringRef.Length = 0xd;
    S_25.super_StringRef.Data = "debug_macinfo";
    pSVar7 = StringSwitch<llvm::StringRef_*,_llvm::StringRef_*>::Case
                       (pSVar7,S_25,
                        (StringRef *)
                        ((long)tVar6.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                               ._M_head_impl + 0x538));
    S_26.super_StringRef.Length = 0x10;
    S_26.super_StringRef.Data = "debug_abbrev.dwo";
    pSVar7 = StringSwitch<llvm::StringRef_*,_llvm::StringRef_*>::Case
                       (pSVar7,S_26,
                        (StringRef *)
                        ((long)tVar6.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                               ._M_head_impl + 0x548));
    S_27.super_StringRef.Length = 0xd;
    S_27.super_StringRef.Data = "debug_str.dwo";
    pSVar7 = StringSwitch<llvm::StringRef_*,_llvm::StringRef_*>::Case
                       (pSVar7,S_27,
                        (StringRef *)
                        ((long)tVar6.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                               ._M_head_impl + 0x558));
    S_28.super_StringRef.Length = 0xe;
    S_28.super_StringRef.Data = "debug_cu_index";
    pSVar7 = StringSwitch<llvm::StringRef_*,_llvm::StringRef_*>::Case
                       (pSVar7,S_28,
                        (StringRef *)
                        ((long)tVar6.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                               ._M_head_impl + 0x568));
    S_29.super_StringRef.Length = 0xe;
    S_29.super_StringRef.Data = "debug_tu_index";
    pSVar7 = StringSwitch<llvm::StringRef_*,_llvm::StringRef_*>::Case
                       (pSVar7,S_29,
                        (StringRef *)
                        ((long)tVar6.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                               ._M_head_impl + 0x588));
    S_30.super_StringRef.Length = 9;
    S_30.super_StringRef.Data = "gdb_index";
    pSVar7 = StringSwitch<llvm::StringRef_*,_llvm::StringRef_*>::Case
                       (pSVar7,S_30,
                        (StringRef *)
                        ((long)tVar6.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                               ._M_head_impl + 0x578));
    S_31.super_StringRef.Length = 0xe;
    S_31.super_StringRef.Data = "debug_line_str";
    pSVar7 = StringSwitch<llvm::StringRef_*,_llvm::StringRef_*>::Case
                       (pSVar7,S_31,
                        (StringRef *)
                        ((long)tVar6.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                               ._M_head_impl + 0x598));
    pSVar8 = StringSwitch<llvm::StringRef_*,_llvm::StringRef_*>::Default(pSVar7,(StringRef *)0x0);
    if (pSVar8 == (StringRef *)0x0) {
      RHS.Length = 10;
      RHS.Data = "debug_info";
      LHS.Length = pSVar4->StrLen;
      LHS.Data = (char *)_Var1.
                         super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                         .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                         _M_head_impl;
      bVar5 = llvm::operator==(LHS,RHS);
      if (bVar5) {
        pcVar10 = *(char **)(pSVar4[1].StrLen + 8);
        lVar11 = *(long *)(pSVar4[1].StrLen + 0x10);
        DObj._M_t.
        super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
        ._M_t.
        super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
        .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl =
             (__uniq_ptr_data<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>,_true,_true>
              )(__uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                )0x0;
        pDVar9 = MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                 ::operator[]((MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                               *)((long)tVar6.
                                        super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                                        .
                                        super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                                        ._M_head_impl + 0x50),(SectionRef *)&DObj);
      }
      else {
        RHS_00.Length = 0xe;
        RHS_00.Data = "debug_info.dwo";
        LHS_00.Length = pSVar4->StrLen;
        LHS_00.Data = (char *)_Var1.
                              super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                              .
                              super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                              ._M_head_impl;
        bVar5 = llvm::operator==(LHS_00,RHS_00);
        if (bVar5) {
          pcVar10 = *(char **)(pSVar4[1].StrLen + 8);
          lVar11 = *(long *)(pSVar4[1].StrLen + 0x10);
          DObj._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl =
               (__uniq_ptr_data<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>,_true,_true>
                )(__uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                  )0x0;
          pDVar9 = MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                   ::operator[]((MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                                 *)((long)tVar6.
                                          super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                                          .
                                          super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                                          ._M_head_impl + 0xe0),(SectionRef *)&DObj);
        }
        else {
          RHS_01.Length = 0xb;
          RHS_01.Data = "debug_types";
          LHS_01.Length = pSVar4->StrLen;
          LHS_01.Data = (char *)_Var1.
                                super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                                ._M_head_impl;
          bVar5 = llvm::operator==(LHS_01,RHS_01);
          if (bVar5) {
            pcVar10 = *(char **)(pSVar4[1].StrLen + 8);
            lVar11 = *(long *)(pSVar4[1].StrLen + 0x10);
            DObj._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
            .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl =
                 (__uniq_ptr_data<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>,_true,_true>
                  )(__uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    )0x0;
            pDVar9 = MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                     ::operator[]((MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                                   *)((long)tVar6.
                                            super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                                            .
                                            super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                                            ._M_head_impl + 0x98),(SectionRef *)&DObj);
          }
          else {
            RHS_02.Length = 0xf;
            RHS_02.Data = "debug_types.dwo";
            LHS_02.Length = pSVar4->StrLen;
            LHS_02.Data = (char *)_Var1.
                                  super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                                  .
                                  super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                                  ._M_head_impl;
            bVar5 = llvm::operator==(LHS_02,RHS_02);
            if (!bVar5) goto LAB_00b268c4;
            pcVar10 = *(char **)(pSVar4[1].StrLen + 8);
            lVar11 = *(long *)(pSVar4[1].StrLen + 0x10);
            DObj._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
            .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl =
                 (__uniq_ptr_data<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>,_true,_true>
                  )(__uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                    )0x0;
            pDVar9 = MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                     ::operator[]((MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                                   *)((long)tVar6.
                                            super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                                            .
                                            super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>
                                            ._M_head_impl + 0x128),(SectionRef *)&DObj);
          }
        }
      }
      (pDVar9->super_DWARFSection).Data.Data = pcVar10;
      (pDVar9->super_DWARFSection).Data.Length = lVar11 - (long)pcVar10;
    }
    else {
      pcVar10 = *(char **)(pSVar4[1].StrLen + 8);
      lVar11 = *(long *)(pSVar4[1].StrLen + 0x10);
      pSVar8->Data = pcVar10;
      pSVar8->Length = lVar11 - (long)pcVar10;
    }
LAB_00b268c4:
    StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

std::unique_ptr<DWARFContext>
DWARFContext::create(const StringMap<std::unique_ptr<MemoryBuffer>> &Sections,
                     uint8_t AddrSize, bool isLittleEndian) {
  auto DObj =
      std::make_unique<DWARFObjInMemory>(Sections, AddrSize, isLittleEndian);
  return std::make_unique<DWARFContext>(std::move(DObj), "");
}